

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::BindDirectiveSyntax::getChild(BindDirectiveSyntax *this,size_t index)

{
  Token token;
  undefined8 in_RDX;
  long in_RSI;
  Info *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  TokenOrSyntax *in_stack_ffffffffffffffb0;
  nullptr_t in_stack_ffffffffffffffb8;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x18),in_stack_ffffffffffffffa8);
    break;
  case 1:
    token.info = in_RDI;
    token._0_8_ = in_stack_ffffffffffffffb8;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,token);
    break;
  case 2:
    not_null<slang::syntax::NameSyntax_*>::get
              ((not_null<slang::syntax::NameSyntax_*> *)(in_RSI + 0x60));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 4:
    not_null<slang::syntax::MemberSyntax_*>::get
              ((not_null<slang::syntax::MemberSyntax_*> *)(in_RSI + 0x70));
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RDI,in_stack_ffffffffffffffb8);
  }
  return (TokenOrSyntax *)in_RDI;
}

Assistant:

TokenOrSyntax BindDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return bind;
        case 2: return target.get();
        case 3: return targetInstances;
        case 4: return instantiation.get();
        default: return nullptr;
    }
}